

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O3

void __thiscall
htmlcxx2::HTML::ParserSax::parseContent<char_const*>(ParserSax *this,char *begin,char *pos)

{
  string text;
  Node node;
  string local_130;
  string local_110;
  string local_f0;
  Node local_d0;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  Node::Node(&local_d0,&local_110,&local_f0,&local_130,this->currentOffset_,
             local_f0._M_string_length,NODE_TEXT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  this->currentOffset_ = this->currentOffset_ + local_d0.length_;
  (*this->_vptr_ParserSax[4])(this);
  Node::~Node(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParserSax::parseContent(It begin, It pos)
{
    std::string text(begin, pos);
    Node node("", text, "", currentOffset_, text.length(), Node::NODE_TEXT);
    currentOffset_ += node.length();
    onFoundText(node);
}